

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_type_pattern_check(ly_ctx *ctx,char *pattern,pcre2_code_8 **code)

{
  char cVar1;
  bool bVar2;
  LY_ERR LVar3;
  size_t sVar4;
  long lVar5;
  undefined1 local_178 [8];
  PCRE2_UCHAR8 err_msg [256];
  LY_ERR r;
  ly_bool escaped;
  pcre2_code_8 *code_local;
  size_t err_offset;
  char *orig_ptr;
  int compile_opts;
  int err_code;
  char *perl_regex;
  size_t brack;
  size_t size;
  size_t idx;
  pcre2_code_8 **code_local_1;
  char *pattern_local;
  ly_ctx *ctx_local;
  
  idx = (size_t)code;
  code_local_1 = (pcre2_code_8 **)pattern;
  pattern_local = (char *)ctx;
  sVar4 = strlen(pattern);
  brack = sVar4 + 1;
  orig_ptr._0_4_ = 0xa00a2010;
  _compile_opts = (char *)malloc(brack);
  if (_compile_opts == (char *)0x0) {
    ly_log((ly_ctx *)pattern_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lys_compile_type_pattern_check");
    return LY_EMEM;
  }
  *_compile_opts = '\0';
  perl_regex = (char *)0x0;
  size = 0;
  bVar2 = false;
  err_offset = (size_t)code_local_1;
  do {
    while( true ) {
      if (*(char *)err_offset == '\0') {
        _compile_opts[size] = '\0';
        LVar3 = lys_compile_pattern_chblocks_xmlschema2perl
                          ((ly_ctx *)pattern_local,(char *)code_local_1,(char **)&compile_opts);
        if (LVar3 != LY_SUCCESS) {
          free(_compile_opts);
          return LVar3;
        }
        lVar5 = pcre2_compile_8(_compile_opts,0xffffffffffffffff,orig_ptr._0_4_,(long)&orig_ptr + 4,
                                &code_local,0);
        if (lVar5 == 0) {
          memset(local_178,0,0x100);
          pcre2_get_error_message_8(orig_ptr._4_4_,local_178,0x100);
          ly_vlog((ly_ctx *)pattern_local,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Regular expression \"%s\" is not valid (\"%s\": %s).",code_local_1,
                  _compile_opts + (long)code_local,local_178);
          free(_compile_opts);
          return LY_EVALID;
        }
        free(_compile_opts);
        if (idx == 0) {
          pcre2_code_free_8(lVar5);
        }
        else {
          *(long *)idx = lVar5;
        }
        return LY_SUCCESS;
      }
      cVar1 = *(char *)err_offset;
      if (cVar1 != '$') break;
LAB_0016ac12:
      if (perl_regex == (char *)0x0) {
        brack = brack + 1;
        _compile_opts = (char *)ly_realloc(_compile_opts,brack);
        if (_compile_opts == (char *)0x0) {
          ly_log((ly_ctx *)pattern_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_pattern_check");
          return LY_EMEM;
        }
        _compile_opts[size] = '\\';
        size = size + 1;
      }
LAB_0016ad41:
      _compile_opts[size] = *(char *)err_offset;
      size = size + 1;
      err_offset = err_offset + 1;
      bVar2 = false;
    }
    if (cVar1 == '[') {
      if (!bVar2) {
        perl_regex = perl_regex + 1;
      }
      goto LAB_0016ad41;
    }
    if (cVar1 != '\\') {
      if (cVar1 == ']') {
        if ((perl_regex == (char *)0x0) && (!bVar2)) {
          ly_vlog((ly_ctx *)pattern_local,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Regular expression \"%s\" is not valid (\"%s\": %s).",code_local_1,err_offset,
                  "character group doesn\'t begin with \'[\'");
          free(_compile_opts);
          return LY_EVALID;
        }
        if (!bVar2) {
          perl_regex = perl_regex + -1;
        }
      }
      else if (cVar1 == '^') goto LAB_0016ac12;
      goto LAB_0016ad41;
    }
    bVar2 = (bool)(bVar2 ^ 1);
    _compile_opts[size] = *(char *)err_offset;
    size = size + 1;
    err_offset = err_offset + 1;
  } while( true );
}

Assistant:

LY_ERR
lys_compile_type_pattern_check(const struct ly_ctx *ctx, const char *pattern, pcre2_code **code)
{
    size_t idx, size, brack;
    char *perl_regex;
    int err_code, compile_opts;
    const char *orig_ptr;
    PCRE2_SIZE err_offset;
    pcre2_code *code_local;
    ly_bool escaped;
    LY_ERR r;

    /* adjust the expression to a Perl equivalent
     * http://www.w3.org/TR/2004/REC-xmlschema-2-20041028/#regexs */

    /* allocate space for the transformed pattern */
    size = strlen(pattern) + 1;
    compile_opts = PCRE2_UTF | PCRE2_UCP | PCRE2_ANCHORED | PCRE2_DOLLAR_ENDONLY | PCRE2_NO_AUTO_CAPTURE;
#ifdef PCRE2_ENDANCHORED
    compile_opts |= PCRE2_ENDANCHORED;
#else
    /* add space for trailing $ anchor */
    size++;
#endif
    perl_regex = malloc(size);
    LY_CHECK_ERR_RET(!perl_regex, LOGMEM(ctx), LY_EMEM);
    perl_regex[0] = '\0';

    /* we need to replace all "$" and "^" (that are not in "[]") with "\$" and "\^" */
    brack = 0;
    idx = 0;
    escaped = 0;
    orig_ptr = pattern;
    while (orig_ptr[0]) {
        switch (orig_ptr[0]) {
        case '$':
        case '^':
            if (!brack) {
                /* make space for the extra character */
                ++size;
                perl_regex = ly_realloc(perl_regex, size);
                LY_CHECK_ERR_RET(!perl_regex, LOGMEM(ctx), LY_EMEM);

                /* print escape slash */
                perl_regex[idx] = '\\';
                ++idx;
            }
            break;
        case '\\':
            /*  escape character found or backslash is escaped */
            escaped = !escaped;
            /* copy backslash and continue with the next character */
            perl_regex[idx] = orig_ptr[0];
            ++idx;
            ++orig_ptr;
            continue;
        case '[':
            if (!escaped) {
                ++brack;
            }
            break;
        case ']':
            if (!brack && !escaped) {
                /* If ']' does not terminate a character class expression, then pcre2_compile() implicitly escapes the
                 * ']' character. But this seems to be against the regular expressions rules declared in
                 * "XML schema: Datatypes" and therefore an error is returned. So for example if pattern is '\[a]' then
                 * pcre2 match characters '[a]' literally but in YANG such pattern is not allowed.
                 */
                LOGVAL(ctx, LY_VCODE_INREGEXP, pattern, orig_ptr, "character group doesn't begin with '['");
                free(perl_regex);
                return LY_EVALID;
            } else if (!escaped) {
                --brack;
            }
            break;
        default:
            break;
        }

        /* copy char */
        perl_regex[idx] = orig_ptr[0];

        ++idx;
        ++orig_ptr;
        escaped = 0;
    }
#ifndef PCRE2_ENDANCHORED
    /* anchor match to end of subject */
    perl_regex[idx++] = '$';
#endif
    perl_regex[idx] = '\0';

    /* transform character blocks */
    if ((r = lys_compile_pattern_chblocks_xmlschema2perl(ctx, pattern, &perl_regex))) {
        free(perl_regex);
        return r;
    }

    /* must return 0, already checked during parsing */
    code_local = pcre2_compile((PCRE2_SPTR)perl_regex, PCRE2_ZERO_TERMINATED, compile_opts,
            &err_code, &err_offset, NULL);
    if (!code_local) {
        PCRE2_UCHAR err_msg[LY_PCRE2_MSG_LIMIT] = {0};

        pcre2_get_error_message(err_code, err_msg, LY_PCRE2_MSG_LIMIT);
        LOGVAL(ctx, LY_VCODE_INREGEXP, pattern, perl_regex + err_offset, err_msg);
        free(perl_regex);
        return LY_EVALID;
    }
    free(perl_regex);

    if (code) {
        *code = code_local;
    } else {
        pcre2_code_free(code_local);
    }

    return LY_SUCCESS;

#undef URANGE_LEN
}